

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::to_func_call_arg_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,Parameter *param_1,uint32_t id)

{
  uint32_t uVar1;
  SPIRVariable *pSVar2;
  SPIRVariable *var;
  uint32_t name_id;
  uint32_t id_local;
  Parameter *param_1_local;
  CompilerGLSL *this_local;
  
  pSVar2 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,id);
  var._0_4_ = id;
  if (pSVar2 != (SPIRVariable *)0x0) {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar2->basevariable);
    if (uVar1 != 0) {
      var._0_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar2->basevariable);
    }
  }
  to_expression_abi_cxx11_(__return_storage_ptr__,this,(uint32_t)var,true);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_func_call_arg(const SPIRFunction::Parameter &, uint32_t id)
{
	// Make sure that we use the name of the original variable, and not the parameter alias.
	uint32_t name_id = id;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && var->basevariable)
		name_id = var->basevariable;
	return to_expression(name_id);
}